

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZContBufferedStream.cpp
# Opt level: O0

TPZContBufferedStream * __thiscall
TPZContBufferedStream::operator<<(TPZContBufferedStream *this,TPZContBufferedStream *other)

{
  long *in_RSI;
  TPZContBufferedStream *in_RDI;
  char *temp;
  uint nBytesOther;
  ulong local_30;
  ulong local_28;
  void *local_20;
  uint local_14;
  long *local_10;
  
  local_14 = (uint)in_RSI[5];
  local_10 = in_RSI;
  local_20 = operator_new__(in_RSI[5] & 0xffffffff);
  local_28 = (ulong)local_14;
  (**(code **)(*local_10 + 0x1c8))(local_10,local_20,&local_28);
  local_30 = (ulong)local_14;
  (*(in_RDI->super_TPZStream)._vptr_TPZStream[0x3a])(in_RDI,local_20,&local_30);
  if (local_20 != (void *)0x0) {
    operator_delete__(local_20);
  }
  return in_RDI;
}

Assistant:

TPZContBufferedStream &TPZContBufferedStream::
operator<<(const TPZContBufferedStream &other) {
    const unsigned int nBytesOther = other.fSize;
    char *temp = new char[nBytesOther];
    other.ConstRead(temp, nBytesOther);
    WriteToBuffer(temp, nBytesOther);
    delete[] temp;
    return *this;
}